

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::interpreter::impl::check_strict_mode_put(impl *this,object_ptr *o,wstring_view p)

{
  bool bVar1;
  property_attribute a_00;
  wostream *pwVar2;
  native_error_exception *pnVar3;
  object *poVar4;
  wstring_view *s;
  wstring_view *s_00;
  wstring_view *s_01;
  wstring local_630 [32];
  wstring_view local_610;
  wstring local_600;
  wstring_view local_5e0;
  wstring local_5d0;
  wostringstream local_5b0 [8];
  wostringstream woss;
  wstring local_430 [32];
  wstring_view local_410;
  wstring local_400;
  wstring_view local_3e0;
  wstring local_3d0;
  wostringstream local_3b0 [8];
  wostringstream woss_2;
  property_attribute a;
  wstring_view local_210;
  wstring local_200;
  wstring_view local_1e0 [2];
  wstring local_1c0;
  wostringstream local_1a0 [8];
  wostringstream woss_1;
  object_ptr *o_local;
  impl *this_local;
  wstring_view p_local;
  
  p_local._M_len = (size_t)p._M_str;
  this_local = (impl *)p._M_len;
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool(&o->super_gc_heap_ptr_untyped);
  if (!bVar1) {
    std::__cxx11::wostringstream::wostringstream(local_1a0);
    cpp_quote_abi_cxx11_(&local_1c0,(mjs *)&this_local,s);
    pwVar2 = std::operator<<((wostream *)local_1a0,(wstring *)&local_1c0);
    std::operator<<(pwVar2," is not defined");
    std::__cxx11::wstring::~wstring((wstring *)&local_1c0);
    pnVar3 = (native_error_exception *)__cxa_allocate_exception(0x58);
    stack_trace_abi_cxx11_(&local_200,this);
    local_1e0[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_200);
    std::__cxx11::wostringstream::str();
    local_210 = (wstring_view)
                std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&a);
    native_error_exception::native_error_exception(pnVar3,reference,local_1e0,&local_210);
    __cxa_throw(pnVar3,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  poVar4 = gc_heap_ptr<mjs::object>::operator->(o);
  a_00 = object::own_property_attributes(poVar4,(wstring_view *)&this_local);
  bVar1 = is_valid(a_00);
  if (bVar1) {
    bVar1 = has_attributes(a_00,read_only);
    if (bVar1) {
      std::__cxx11::wostringstream::wostringstream(local_3b0);
      pwVar2 = std::operator<<((wostream *)local_3b0,"Cannot assign to read only property ");
      cpp_quote_abi_cxx11_(&local_3d0,(mjs *)&this_local,s_00);
      pwVar2 = std::operator<<(pwVar2,(wstring *)&local_3d0);
      std::operator<<(pwVar2," in strict mode");
      std::__cxx11::wstring::~wstring((wstring *)&local_3d0);
      pnVar3 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_400,this);
      local_3e0 = (wstring_view)
                  std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_400);
      std::__cxx11::wostringstream::str();
      local_410 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_430)
      ;
      native_error_exception::native_error_exception(pnVar3,type,&local_3e0,&local_410);
      __cxa_throw(pnVar3,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
  else {
    poVar4 = gc_heap_ptr<mjs::object>::operator->(o);
    bVar1 = object::is_extensible(poVar4);
    if (!bVar1) {
      std::__cxx11::wostringstream::wostringstream(local_5b0);
      pwVar2 = std::operator<<((wostream *)local_5b0,"Cannot add property ");
      cpp_quote_abi_cxx11_(&local_5d0,(mjs *)&this_local,s_01);
      pwVar2 = std::operator<<(pwVar2,(wstring *)&local_5d0);
      std::operator<<(pwVar2," to non-extensible object in strict mode");
      std::__cxx11::wstring::~wstring((wstring *)&local_5d0);
      pnVar3 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_600,this);
      local_5e0 = (wstring_view)
                  std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_600);
      std::__cxx11::wostringstream::str();
      local_610 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_630)
      ;
      native_error_exception::native_error_exception(pnVar3,type,&local_5e0,&local_610);
      __cxa_throw(pnVar3,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
  return;
}

Assistant:

void check_strict_mode_put(const object_ptr& o, const std::wstring_view p) const {
        if (!o) {
            std::wostringstream woss;
            woss << cpp_quote(p) << " is not defined";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }

        // ES5.1, 11.13.1
        if (const auto a = o->own_property_attributes(p); is_valid(a)) {
            if (!has_attributes(a, property_attribute::read_only)) {
                // OK property is writable
                return;
            }
            std::wostringstream woss;
            woss << "Cannot assign to read only property " << cpp_quote(p) << " in strict mode";
            throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
        }

        if (o->is_extensible()) {
            // OK property doesn't exist, but object is extensible
            return;
        }

        std::wostringstream woss;
        woss << "Cannot add property " << cpp_quote(p) << " to non-extensible object in strict mode";
        throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
    }